

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O3

void SyncBlockcStatement_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  int iVar1;
  JsVm *pJVar2;
  __jmp_buf_tag *__env;
  JsValue *e;
  undefined4 *extraout_RDX;
  JsContext *val;
  JsEngine *val_00;
  double dVar3;
  JsValue JStack_c0;
  JsValue JStack_a8;
  JsValue *pJStack_90;
  undefined1 local_60 [8];
  JsValue v0;
  JsValue v1;
  
  context->pc = na->location;
  val = context;
  val_00 = (JsEngine *)na;
  pJVar2 = JsGetVm();
  if (pJVar2->debug == 1) {
    pJVar2 = JsGetVm();
    if (pJVar2->trace != (JsVmTraceFn)0x0) {
      pJVar2 = JsGetVm();
      val_00 = context->engine;
      val = (JsContext *)na->location;
      (*pJVar2->trace)(val_00,(JsLocation *)val,JS_TRACE_STATEMENT);
    }
  }
  if (na[1].astClass == NODECLASS_Unary) {
    JsFindValueRef(context,(char *)na[1].location,(JsValue *)local_60);
    JsGetValue((JsValue *)local_60,(JsValue *)((long)&v0.u + 8));
    if (v1._0_8_ == 0 || v0.u.completion.type != (JS_COMPLETION_THROW|JS_COMPLETION_BREAK)) {
      JsThrowString("ident is\'t a object");
    }
  }
  else {
    if (na[1].astClass != NODECLASS_None) {
      SyncBlockcStatement_eval_cold_1();
      pJStack_90 = res;
      JsToNumber((JsValue *)val_00,&JStack_c0);
      JsToNumber((JsValue *)val,&JStack_a8);
      *extraout_RDX = 3;
      dVar3 = fmod(JStack_c0.u.number,JStack_a8.u.number);
      *(double *)(extraout_RDX + 2) = dVar3;
      return;
    }
    v1._0_8_ = context->thisObj;
  }
  JsLockup(((JsObject *)v1._0_8_)->SyncLock);
  __env = (__jmp_buf_tag *)JsMalloc(200);
  iVar1 = _setjmp(__env);
  if (iVar1 == 0) {
    JsBuildDefender(__env);
    (*JsNodeClassEval[(*(JsAstNode **)(na + 2))->astClass])(*(JsAstNode **)(na + 2),context,res);
  }
  JsOmitDefender();
  e = JsCatchException();
  JsUnlock(((JsObject *)v1._0_8_)->SyncLock);
  if (e != (JsValue *)0x0) {
    JsReThrowException(e);
  }
  return;
}

Assistant:

static void SyncBlockcStatement_eval(struct JsAstNode *na, 
        struct JsContext *context, struct JsValue *res){
		
	struct JsAstSyncBlockStatementNode *n = CAST_NODE(na, JsAstSyncBlockStatementNode);	
	TRACE(na->location, context, JS_TRACE_STATEMENT);
	
	struct JsObject* lockObj = NULL;
	struct JsValue* e = NULL;
	struct JsValue v0,v1;
	if(n->type == JS_SYNC_THIS_BLOCK_NODE){
		//this block
		lockObj = context->thisObj;
		
	}else if(n->type == JS_SYNC_IDENT_BLOCK_NODE){
		JsFindValueRef(context,n->ident,&v0);
		JsGetValue(&v0,&v1);
		if(v1.type != JS_OBJECT || v1.u.object == NULL){
			JsThrowString("ident is't a object");
		}
		lockObj = v1.u.object;
	}else{
		JsThrowString("synchronzied syntax error");
	}
	//对Block加锁
	JsLockup(lockObj->SyncLock);
	JS_TRY(0){
		EVAL(n->a,context,res);
	}
	JS_CATCH(e){
		//如果期间发现异常, 则先解锁, 在抛出
		JsUnlock(lockObj->SyncLock);
		JsReThrowException(e);
		return;
	}
	//对Block解锁
	JsUnlock(lockObj->SyncLock);
	return;
	
}